

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_shaderiv(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  GLint local_20;
  GLuint local_1c;
  GLint param [1];
  GLuint program;
  GLuint shader;
  GLboolean shaderCompilerSupported;
  NegativeTestContext *ctx_local;
  
  _shader = ctx;
  param[0] = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_1c = glu::CallLogWrapper::glCreateProgram(&_shader->super_CallLogWrapper);
  local_20 = -1;
  glu::CallLogWrapper::glGetBooleanv
            (&_shader->super_CallLogWrapper,0x8dfa,(GLboolean *)((long)&program + 3));
  this = glu::CallLogWrapper::getLog(&_shader->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_1a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [25])"// GL_SHADER_COMPILER = ");
  local_1b8[0] = "mapped_ == GL_FALSE";
  if (program._3_1_ != '\0') {
    local_1b8[0] = "mapped_ == GL_TRUE";
  }
  local_1b8[0] = local_1b8[0] + 0xb;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_1d9);
  NegativeTestContext::beginSection(pNVar1,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  glu::CallLogWrapper::glGetShaderiv(&_shader->super_CallLogWrapper,param[0],0xffffffff,&local_20);
  NegativeTestContext::expectError(_shader,0x500);
  NegativeTestContext::endSection(_shader);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",
             &local_201);
  NegativeTestContext::beginSection(pNVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  glu::CallLogWrapper::glGetShaderiv(&_shader->super_CallLogWrapper,0xffffffff,0x8b4f,&local_20);
  NegativeTestContext::expectError(_shader,0x501);
  NegativeTestContext::endSection(_shader);
  pNVar1 = _shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "GL_INVALID_OPERATION is generated if shader does not refer to a shader object.",
             &local_229);
  NegativeTestContext::beginSection(pNVar1,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  glu::CallLogWrapper::glGetShaderiv(&_shader->super_CallLogWrapper,local_1c,0x8b4f,&local_20);
  NegativeTestContext::expectError(_shader,0x502);
  NegativeTestContext::endSection(_shader);
  glu::CallLogWrapper::glDeleteShader(&_shader->super_CallLogWrapper,param[0]);
  glu::CallLogWrapper::glDeleteProgram(&_shader->super_CallLogWrapper,local_1c);
  return;
}

Assistant:

void get_shaderiv (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLuint		shader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint		program		= ctx.glCreateProgram();
	GLint		param[1]	= { -1 };

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetShaderiv(shader, -1, &param[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glGetShaderiv(-1, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader does not refer to a shader object.");
	ctx.glGetShaderiv(program, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(program);
}